

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O1

VariableIndex __thiscall
cnn::ComputationGraph::add_lookup(ComputationGraph *this,LookupParameters *p,uint *pindex)

{
  iterator __position;
  iterator __position_00;
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  undefined8 in_RCX;
  Node *local_30;
  
  __position._M_current = *(Node ***)(p->dim).d;
  *(int *)&(this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start =
       (int)((ulong)((long)__position._M_current -
                    (long)(p->super_ParametersBase)._vptr_ParametersBase) >> 3);
  local_30 = (Node *)operator_new(0xa8);
  (local_30->dim).nd = 0;
  (local_30->dim).bd = 1;
  (local_30->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_30->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_30->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30->_vptr_Node = (_func_int **)&PTR__LookupNode_002ae240;
  pVVar1 = *(pointer *)(pindex + 4);
  pVVar2 = *(pointer *)(pindex + 6);
  pVVar3 = *(pointer *)(pindex + 8);
  local_30[1]._vptr_Node = *(_func_int ***)(pindex + 2);
  local_30[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = pVVar1;
  local_30[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = pVVar2;
  local_30[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pVVar3;
  local_30[1].dim.d[0] = pindex[10];
  local_30[1].dim.d[1] = 0;
  *(undefined8 *)(local_30[1].dim.d + 2) = in_RCX;
  local_30[1].dim.d[4] = 0;
  local_30[1].dim.d[5] = 0;
  *(undefined8 *)(local_30[1].dim.d + 6) = 0;
  *(undefined8 *)&local_30[1].dim.bd = 0;
  local_30[1].aux_mem = (void *)0x0;
  local_30[2]._vptr_Node = (_func_int **)pindex;
  if (__position._M_current == *(Node ***)((p->dim).d + 2)) {
    std::vector<cnn::Node*,std::allocator<cnn::Node*>>::_M_realloc_insert<cnn::Node*>
              ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)p,__position,&local_30);
  }
  else {
    *__position._M_current = local_30;
    *(long *)(p->dim).d = *(long *)(p->dim).d + 8;
  }
  __position_00._M_current = *(VariableIndex **)((p->dim).d + 6);
  if (__position_00._M_current == *(VariableIndex **)&(p->dim).bd) {
    std::vector<cnn::VariableIndex,std::allocator<cnn::VariableIndex>>::
    _M_realloc_insert<cnn::VariableIndex_const&>
              ((vector<cnn::VariableIndex,std::allocator<cnn::VariableIndex>> *)((p->dim).d + 4),
               __position_00,(VariableIndex *)this);
  }
  else {
    (__position_00._M_current)->t =
         *(uint *)&(this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    *(VariableIndex **)((p->dim).d + 6) = __position_00._M_current + 1;
  }
  set_dim_for_new_node((ComputationGraph *)p,(VariableIndex *)this);
  return (VariableIndex)(uint)this;
}

Assistant:

VariableIndex ComputationGraph::add_lookup(LookupParameters* p, const unsigned* pindex) {
  VariableIndex new_node_index(nodes.size());
  LookupNode* new_node = new LookupNode(p, pindex);
  nodes.push_back(new_node);
  parameter_nodes.push_back(new_node_index);
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}